

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void CVmObjDict::enum_word_props_cb(void *ctx0,CVmHashEntry *entry0)

{
  int iVar1;
  CVmHashEntryDict *in_RSI;
  undefined8 *in_RDI;
  size_t in_stack_00000020;
  char *in_stack_00000028;
  vm_dict_entry *cur;
  vm_val_t match_val;
  CVmHashEntryDict *entry;
  enum_word_props_ctx *ctx;
  vm_dict_entry *local_38;
  undefined1 local_30 [16];
  CVmHashEntryDict *local_20;
  undefined8 *local_18;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  CVmHashEntry::getstr((CVmHashEntry *)in_RSI);
  CVmHashEntry::getlen((CVmHashEntry *)local_20);
  iVar1 = match_strings((CVmObjDict *)entry,(vm_val_t *)match_val.val.native_desc,
                        (char *)match_val._0_8_,(size_t)cur,in_stack_00000028,in_stack_00000020,
                        (vm_val_t *)ctx0);
  if (iVar1 != 0) {
    for (local_38 = CVmHashEntryDict::get_head(local_20); local_38 != (vm_dict_entry *)0x0;
        local_38 = local_38->nxt_) {
      (*(code *)*local_18)(local_18[4],local_38->prop_,local_30);
    }
  }
  return;
}

Assistant:

void CVmObjDict::enum_word_props_cb(void *ctx0, CVmHashEntry *entry0)
{
    enum_word_props_ctx *ctx = (enum_word_props_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    vm_val_t match_val;
    VMGLOB_PTR(ctx->globals);

    /* if this entry matches the search string, process it */
    if (ctx->dict->match_strings(vmg_ ctx->strval, ctx->strp, ctx->strl,
                                 entry->getstr(), entry->getlen(),
                                 &match_val))
    {
        vm_dict_entry *cur;
        
        /* process the items under this entry */
        for (cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
        {
            /* invoke the callback */
            (*ctx->cb_func)(vmg_ ctx->cb_ctx, cur->prop_, &match_val);
        }
    }
}